

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O0

int mbedtls_gcm_setkey(mbedtls_gcm_context *ctx,mbedtls_cipher_id_t cipher,uchar *key,uint keybits)

{
  mbedtls_cipher_info_t *info;
  size_t sVar1;
  mbedtls_cipher_id_t in_ECX;
  mbedtls_cipher_info_t *cipher_info;
  int ret;
  mbedtls_operation_t in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (((in_ECX == 0x80) || (in_ECX == 0xc0)) || (in_ECX == 0x100)) {
    info = mbedtls_cipher_info_from_values
                     (in_ECX,-0x6e,(mbedtls_cipher_mode_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20)
                     );
    if (info == (mbedtls_cipher_info_t *)0x0) {
      iVar2 = -0x14;
    }
    else {
      sVar1 = mbedtls_cipher_info_get_block_size(info);
      if (sVar1 == 0x10) {
        mbedtls_cipher_free((mbedtls_cipher_context_t *)0x87a2c9);
        iVar2 = mbedtls_cipher_setup
                          ((mbedtls_cipher_context_t *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           (mbedtls_cipher_info_t *)0x87a2d8);
        if (((iVar2 == 0) &&
            (iVar2 = mbedtls_cipher_setkey
                               ((mbedtls_cipher_context_t *)((ulong)in_ECX << 0x20),(uchar *)info,
                                in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8), iVar2 == 0))
           && (iVar2 = gcm_gen_table((mbedtls_gcm_context *)
                                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
              iVar2 == 0)) {
          iVar2 = 0;
        }
      }
      else {
        iVar2 = -0x14;
      }
    }
  }
  else {
    iVar2 = -0x14;
  }
  return iVar2;
}

Assistant:

int mbedtls_gcm_setkey(mbedtls_gcm_context *ctx,
                       mbedtls_cipher_id_t cipher,
                       const unsigned char *key,
                       unsigned int keybits)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (keybits != 128 && keybits != 192 && keybits != 256) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

#if defined(MBEDTLS_BLOCK_CIPHER_C)
    mbedtls_block_cipher_free(&ctx->block_cipher_ctx);

    if ((ret = mbedtls_block_cipher_setup(&ctx->block_cipher_ctx, cipher)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_block_cipher_setkey(&ctx->block_cipher_ctx, key, keybits)) != 0) {
        return ret;
    }
#else
    const mbedtls_cipher_info_t *cipher_info;

    cipher_info = mbedtls_cipher_info_from_values(cipher, keybits,
                                                  MBEDTLS_MODE_ECB);
    if (cipher_info == NULL) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    if (mbedtls_cipher_info_get_block_size(cipher_info) != 16) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    mbedtls_cipher_free(&ctx->cipher_ctx);

    if ((ret = mbedtls_cipher_setup(&ctx->cipher_ctx, cipher_info)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_cipher_setkey(&ctx->cipher_ctx, key, keybits,
                                     MBEDTLS_ENCRYPT)) != 0) {
        return ret;
    }
#endif

    if ((ret = gcm_gen_table(ctx)) != 0) {
        return ret;
    }

    return 0;
}